

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O2

string * __thiscall
t_json_generator::get_qualified_name_abi_cxx11_
          (string *__return_storage_ptr__,t_json_generator *this,t_type *ttype)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if ((this->should_merge_includes_ == false) &&
     (ttype->program_ != (this->super_t_generator).program_)) {
    std::operator+(&local_30,&ttype->program_->name_,".");
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::operator+(__return_storage_ptr__,&local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var_00,iVar1));
  }
  return __return_storage_ptr__;
}

Assistant:

string t_json_generator::get_qualified_name(t_type* ttype) {
  if (should_merge_includes_ || ttype->get_program() == program_) {
    return ttype->get_name();
  }
  return ttype->get_program()->get_name() + "." + ttype->get_name();
}